

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picohttpparser.c
# Opt level: O0

char * parse_request(char *buf,char *buf_end,char **method,size_t *method_len,char **path,
                    size_t *path_len,int *minor_version,phr_header *headers,size_t *num_headers,
                    size_t max_headers,int *ret)

{
  char *pcVar1;
  int local_5c;
  char **ppcStack_58;
  int found2_1;
  char *tok_start_1;
  char *pcStack_48;
  int found2;
  char *tok_start;
  size_t *path_len_local;
  char **path_local;
  size_t *method_len_local;
  char **method_local;
  char *buf_end_local;
  char *buf_local;
  
  if (buf == buf_end) {
    *ret = -2;
    return (char *)0x0;
  }
  if (*buf == '\r') {
    if (buf + 1 == buf_end) {
      *ret = -2;
      return (char *)0x0;
    }
    buf_end_local = buf + 2;
    if (buf[1] != '\n') {
      *ret = -1;
      return (char *)0x0;
    }
  }
  else {
    buf_end_local = buf;
    if (*buf == '\n') {
      buf_end_local = buf + 1;
    }
  }
  pcStack_48 = buf_end_local;
  tok_start = (char *)path_len;
  path_len_local = (size_t *)path;
  path_local = (char **)method_len;
  method_len_local = (size_t *)method;
  method_local = (char **)buf_end;
  buf_end_local = findchar_fast(buf_end_local,buf_end,"",4,(int *)((long)&tok_start_1 + 4));
  if ((tok_start_1._4_4_ == 0) && ((char **)buf_end_local == method_local)) {
    *ret = -2;
    return (char *)0x0;
  }
  while (*buf_end_local != ' ') {
    if ((0x5e < (byte)*buf_end_local - 0x20) &&
       (((byte)*buf_end_local < 0x20 || (*buf_end_local == '\x7f')))) {
      *ret = -1;
      return (char *)0x0;
    }
    buf_end_local = buf_end_local + 1;
    if ((char **)buf_end_local == method_local) {
      *ret = -2;
      return (char *)0x0;
    }
  }
  *method_len_local = (size_t)pcStack_48;
  *path_local = buf_end_local + -(long)pcStack_48;
  do {
    ppcStack_58 = (char **)(buf_end_local + 1);
    if (ppcStack_58 == method_local) {
      *ret = -2;
      return (char *)0x0;
    }
    buf_end_local = (char *)ppcStack_58;
  } while (*(char *)ppcStack_58 == ' ');
  buf_end_local = findchar_fast((char *)ppcStack_58,(char *)method_local,"",4,&local_5c);
  if ((local_5c == 0) && ((char **)buf_end_local == method_local)) {
    *ret = -2;
    return (char *)0x0;
  }
  while (*buf_end_local != ' ') {
    if ((0x5e < (byte)*buf_end_local - 0x20) &&
       (((byte)*buf_end_local < 0x20 || (*buf_end_local == '\x7f')))) {
      *ret = -1;
      return (char *)0x0;
    }
    buf_end_local = buf_end_local + 1;
    if ((char **)buf_end_local == method_local) {
      *ret = -2;
      return (char *)0x0;
    }
  }
  *path_len_local = (size_t)ppcStack_58;
  *(long *)tok_start = (long)buf_end_local - (long)ppcStack_58;
  do {
    buf_end_local = buf_end_local + 1;
    if ((char **)buf_end_local == method_local) {
      *ret = -2;
      return (char *)0x0;
    }
  } while (*buf_end_local == ' ');
  if ((*path_local == (char *)0x0) || (*(long *)tok_start == 0)) {
    *ret = -1;
    buf_local = (char *)0x0;
  }
  else {
    pcVar1 = parse_http_version(buf_end_local,(char *)method_local,minor_version,ret);
    if (pcVar1 == (char *)0x0) {
      buf_local = (char *)0x0;
    }
    else {
      if (*pcVar1 == '\r') {
        if ((char **)(pcVar1 + 1) == method_local) {
          *ret = -2;
          return (char *)0x0;
        }
        buf_end_local = pcVar1 + 2;
        if (pcVar1[1] != '\n') {
          *ret = -1;
          return (char *)0x0;
        }
      }
      else {
        if (*pcVar1 != '\n') {
          *ret = -1;
          return (char *)0x0;
        }
        buf_end_local = pcVar1 + 1;
      }
      buf_local = parse_headers(buf_end_local,(char *)method_local,headers,num_headers,max_headers,
                                ret);
    }
  }
  return buf_local;
}

Assistant:

static const char *parse_request(const char *buf, const char *buf_end, const char **method, size_t *method_len, const char **path,
                                 size_t *path_len, int *minor_version, struct phr_header *headers, size_t *num_headers,
                                 size_t max_headers, int *ret)
{
    /* skip first empty line (some clients add CRLF after POST content) */
    CHECK_EOF();
    if (*buf == '\015') {
        ++buf;
        EXPECT_CHAR('\012');
    } else if (*buf == '\012') {
        ++buf;
    }

    /* parse request line */
    ADVANCE_TOKEN(*method, *method_len);
    do {
        ++buf;
        CHECK_EOF();
    } while (*buf == ' ');
    ADVANCE_TOKEN(*path, *path_len);
    do {
        ++buf;
        CHECK_EOF();
    } while (*buf == ' ');
    if (*method_len == 0 || *path_len == 0) {
        *ret = -1;
        return NULL;
    }
    if ((buf = parse_http_version(buf, buf_end, minor_version, ret)) == NULL) {
        return NULL;
    }
    if (*buf == '\015') {
        ++buf;
        EXPECT_CHAR('\012');
    } else if (*buf == '\012') {
        ++buf;
    } else {
        *ret = -1;
        return NULL;
    }

    return parse_headers(buf, buf_end, headers, num_headers, max_headers, ret);
}